

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

bool __thiscall BuildLog::Recompact(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  char *pcVar3;
  Metrics *this_00;
  string *psVar4;
  char cVar5;
  int iVar6;
  FILE *__stream;
  int *piVar7;
  char *pcVar8;
  Metric *pMVar9;
  _Hash_node_base *p_Var10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  string temp_path;
  vector<StringPiece,_std::allocator<StringPiece>_> dead_outputs;
  ScopedMetric metrics_h_scoped;
  string local_80;
  string *local_60;
  StringPiece *local_58;
  iterator iStack_50;
  StringPiece *local_48;
  ScopedMetric local_40;
  
  if ((Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)::
       metrics_h_metric == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar6 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar9 = (Metric *)0x0;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".ninja_log recompact","")
      ;
      pMVar9 = Metrics::NewMetric(this_00,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    Recompact::metrics_h_metric = pMVar9;
    __cxa_guard_release(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,Recompact::metrics_h_metric);
  Close(this);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
  local_60 = err;
  std::__cxx11::string::append((char *)&local_80);
  __stream = fopen(local_80._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    psVar4 = local_60;
    pcVar3 = (char *)local_60->_M_string_length;
    strlen(pcVar8);
    bVar13 = false;
    std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar8);
    goto LAB_001073a4;
  }
  iVar6 = fprintf(__stream,"# ninja log v%d\n",5);
  if (iVar6 < 0) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    psVar4 = local_60;
    pcVar3 = (char *)local_60->_M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar8);
    fclose(__stream);
    bVar13 = false;
    goto LAB_001073a4;
  }
  local_58 = (StringPiece *)0x0;
  iStack_50._M_current = (StringPiece *)0x0;
  local_48 = (StringPiece *)0x0;
  p_Var10 = (this->entries_)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      cVar5 = (*(code *)**(undefined8 **)user)(user,p_Var10[1]._M_nxt,p_Var10[2]._M_nxt);
      if (cVar5 == '\0') {
        p_Var2 = p_Var10[3]._M_nxt;
        iVar6 = fprintf(__stream,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)*(uint *)&p_Var2[5]._M_nxt,
                        (ulong)*(uint *)((long)&p_Var2[5]._M_nxt + 4),p_Var2[6]._M_nxt,
                        p_Var2->_M_nxt,p_Var2[4]._M_nxt);
        if (iVar6 < 1) {
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          psVar4 = local_60;
          pcVar3 = (char *)local_60->_M_string_length;
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar8);
          fclose(__stream);
          bVar13 = false;
          goto LAB_0010738d;
        }
      }
      else if (iStack_50._M_current == local_48) {
        std::vector<StringPiece,std::allocator<StringPiece>>::_M_realloc_insert<StringPiece_const&>
                  ((vector<StringPiece,std::allocator<StringPiece>> *)&local_58,iStack_50,
                   (StringPiece *)(p_Var10 + 1));
      }
      else {
        p_Var2 = p_Var10[2]._M_nxt;
        (iStack_50._M_current)->str_ = ((StringPiece *)(p_Var10 + 1))->str_;
        (iStack_50._M_current)->len_ = (size_t)p_Var2;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
    if (iStack_50._M_current != local_58) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        std::
        _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(long)&local_58->str_ + lVar11);
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar12 < (ulong)((long)iStack_50._M_current - (long)local_58 >> 4));
    }
  }
  fclose(__stream);
  iVar6 = unlink((path->_M_dataplus)._M_p);
  if (iVar6 < 0) {
LAB_00107299:
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    psVar4 = local_60;
    pcVar3 = (char *)local_60->_M_string_length;
    strlen(pcVar8);
    bVar13 = false;
    std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar3,(ulong)pcVar8);
  }
  else {
    iVar6 = rename(local_80._M_dataplus._M_p,(path->_M_dataplus)._M_p);
    bVar13 = true;
    if (iVar6 < 0) goto LAB_00107299;
  }
LAB_0010738d:
  if (local_58 != (StringPiece *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
LAB_001073a4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar13;
}

Assistant:

bool BuildLog::Recompact(const string& path, const BuildLogUser& user,
                         string* err) {
  METRIC_RECORD(".ninja_log recompact");

  Close();
  string temp_path = path + ".recompact";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }

  vector<StringPiece> dead_outputs;
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    if (user.IsPathDead(i->first)) {
      dead_outputs.push_back(i->first);
      continue;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  for (size_t i = 0; i < dead_outputs.size(); ++i)
    entries_.erase(dead_outputs[i]);

  fclose(f);
  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}